

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O2

bool __thiscall CGameControllerCTF::OnEntity(CGameControllerCTF *this,int Index,vec2 Pos)

{
  bool bVar1;
  CFlag *this_00;
  bool bVar2;
  uint Team;
  undefined4 in_register_00000034;
  size_t Size;
  
  Size = CONCAT44(in_register_00000034,Index);
  bVar1 = IGameController::OnEntity(&this->super_IGameController,Index,Pos);
  bVar2 = true;
  if (!bVar1) {
    Team = 1;
    if (Index != 5) {
      Team = -(uint)(Index != 4);
    }
    if ((Index - 6U < 0xfffffffe) || (this->m_apFlags[Team] != (CFlag *)0x0)) {
      bVar2 = false;
    }
    else {
      this_00 = (CFlag *)CEntity::operator_new((CEntity *)0x60,Size);
      CFlag::CFlag(this_00,&((this->super_IGameController).m_pGameServer)->m_World,Team,Pos);
      this->m_apFlags[Team] = this_00;
    }
  }
  return bVar2;
}

Assistant:

bool CGameControllerCTF::OnEntity(int Index, vec2 Pos)
{
	if(IGameController::OnEntity(Index, Pos))
		return true;

	int Team = -1;
	if(Index == ENTITY_FLAGSTAND_RED) Team = TEAM_RED;
	if(Index == ENTITY_FLAGSTAND_BLUE) Team = TEAM_BLUE;
	if(Team == -1 || m_apFlags[Team])
		return false;

	CFlag *F = new CFlag(&GameServer()->m_World, Team, Pos);
	m_apFlags[Team] = F;
	return true;
}